

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockGetDomainProperties
          (zes_overclock_handle_t hDomainHandle,zes_overclock_properties_t *pDomainProperties)

{
  zes_pfnOverclockGetDomainProperties_t pfnGetDomainProperties;
  ze_result_t result;
  zes_overclock_properties_t *pDomainProperties_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnGetDomainProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb30 != (code *)0x0) {
    pfnGetDomainProperties._4_4_ = (*DAT_0011cb30)(hDomainHandle,pDomainProperties);
  }
  return pfnGetDomainProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetDomainProperties(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_properties_t* pDomainProperties   ///< [in,out] The overclock properties for the specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDomainProperties = context.zesDdiTable.Overclock.pfnGetDomainProperties;
        if( nullptr != pfnGetDomainProperties )
        {
            result = pfnGetDomainProperties( hDomainHandle, pDomainProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }